

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

void yang_free_nodes(ly_ctx *ctx,lys_node *node)

{
  lys_node *node_00;
  lys_node *plVar1;
  void *pvVar2;
  LYS_NODE LVar3;
  char *pcVar4;
  lys_node *value;
  lys_when *w;
  uint8_t i;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  
  if (node != (lys_node *)0x0) {
    while (node != (lys_node *)0x0) {
      node_00 = node->child;
      plVar1 = node->next;
      lydict_remove(ctx,node->name);
      LVar3 = node->nodetype;
      if ((LVar3 & (LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN) {
        lys_iffeature_free(ctx,node->iffeature,node->iffeature_size,0,
                           (_func_void_lys_node_ptr_void_ptr *)0x0);
        lydict_remove(ctx,node->dsc);
        lydict_remove(ctx,node->ref);
        LVar3 = node->nodetype;
      }
      switch(LVar3) {
      case LYS_CONTAINER:
        yang_tpdf_free(ctx,(lys_tpdf *)node[1].ref,0,*(uint16_t *)(node->padding + 2));
        free(node[1].ref);
        lydict_remove(ctx,*(char **)&node[1].flags);
        lVar7 = 0;
        for (uVar5 = 0; pcVar4 = node[1].dsc, uVar5 < node->padding[1]; uVar5 = uVar5 + 1) {
          lys_restr_free(ctx,(lys_restr *)(pcVar4 + lVar7),(_func_void_lys_node_ptr_void_ptr *)0x0);
          lVar7 = lVar7 + 0x38;
        }
LAB_0015213c:
        free(pcVar4);
        w = (lys_when *)node[1].name;
        break;
      case LYS_CHOICE:
        free(node[1].name);
LAB_00152297:
        w = *(lys_when **)node->hash;
        break;
      case LYS_CHOICE|LYS_CONTAINER:
      case LYS_LEAF|LYS_CONTAINER:
      case LYS_LEAF|LYS_CHOICE:
      case LYS_LEAF|LYS_CHOICE|LYS_CONTAINER:
        goto switchD_001520b5_caseD_3;
      case LYS_LEAF:
        lVar7 = 0;
        for (uVar5 = 0; uVar5 < node->padding[3]; uVar5 = uVar5 + 1) {
          lys_restr_free(ctx,(lys_restr *)(node[1].dsc + lVar7),
                         (_func_void_lys_node_ptr_void_ptr *)0x0);
          lVar7 = lVar7 + 0x38;
        }
        free(node[1].dsc);
        lys_when_free(ctx,(lys_when *)node[1].name,(_func_void_lys_node_ptr_void_ptr *)0x0);
        yang_type_free(ctx,(lys_type *)&node[1].ref);
        lydict_remove(ctx,(char *)node[1].next);
        value = node[1].prev;
        goto LAB_00152281;
      case LYS_LEAFLIST:
        lVar7 = 0;
        for (uVar5 = 0; uVar5 < node->padding[3]; uVar5 = uVar5 + 1) {
          lys_restr_free(ctx,(lys_restr *)(node[1].dsc + lVar7),
                         (_func_void_lys_node_ptr_void_ptr *)0x0);
          lVar7 = lVar7 + 0x38;
        }
        free(node[1].dsc);
        for (uVar5 = 0; uVar5 < node->padding[2]; uVar5 = uVar5 + 1) {
          lydict_remove(ctx,*(char **)((node[1].prev)->padding + uVar5 * 8 + -0x1c));
        }
        free(node[1].prev);
        lys_when_free(ctx,(lys_when *)node[1].name,(_func_void_lys_node_ptr_void_ptr *)0x0);
        yang_type_free(ctx,(lys_type *)&node[1].ref);
        value = node[1].next;
LAB_00152281:
        lydict_remove(ctx,(char *)value);
        goto switchD_001520b5_caseD_3;
      default:
        if (LVar3 == LYS_LIST) {
          yang_tpdf_free(ctx,(lys_tpdf *)node[1].ref,0,(ushort)node->padding[1]);
          free(node[1].ref);
          lVar7 = 0;
          for (uVar5 = 0; uVar5 < node->padding[0]; uVar5 = uVar5 + 1) {
            lys_restr_free(ctx,(lys_restr *)(node[1].dsc + lVar7),
                           (_func_void_lys_node_ptr_void_ptr *)0x0);
            lVar7 = lVar7 + 0x38;
          }
          free(node[1].dsc);
          lys_when_free(ctx,(lys_when *)node[1].name,(_func_void_lys_node_ptr_void_ptr *)0x0);
          lVar7 = 0;
          for (uVar5 = 0; uVar5 < node->padding[3]; uVar5 = uVar5 + 1) {
            free(*(void **)((long)node[1].ext + lVar7));
            lVar7 = lVar7 + 0x10;
          }
          free(node[1].ext);
          pcVar4 = *(char **)&node[1].flags;
          goto LAB_0015249a;
        }
        if (LVar3 == LYS_ANYXML) {
LAB_00152112:
          lVar7 = 0;
          for (uVar5 = 0; pcVar4 = node[1].dsc, uVar5 < node->padding[3]; uVar5 = uVar5 + 1) {
            lys_restr_free(ctx,(lys_restr *)(pcVar4 + lVar7),(_func_void_lys_node_ptr_void_ptr *)0x0
                          );
            lVar7 = lVar7 + 0x38;
          }
          goto LAB_0015213c;
        }
        if (LVar3 == LYS_CASE) goto LAB_00152297;
        if (LVar3 == LYS_NOTIF) {
          yang_tpdf_free(ctx,(lys_tpdf *)node[1].name,0,*(uint16_t *)(node->padding + 2));
          free(node[1].name);
          lVar7 = 0;
          for (uVar5 = 0; pcVar4 = node[1].dsc, uVar5 < node->padding[1]; uVar5 = uVar5 + 1) {
            lys_restr_free(ctx,(lys_restr *)(pcVar4 + lVar7),(_func_void_lys_node_ptr_void_ptr *)0x0
                          );
            lVar7 = lVar7 + 0x38;
          }
LAB_0015249a:
          free(pcVar4);
        }
        else {
          if (LVar3 == LYS_RPC) {
LAB_00152091:
            yang_tpdf_free(ctx,*(lys_tpdf **)node->hash,0,*(uint16_t *)(node->padding + 2));
            pcVar4 = *(char **)node->hash;
            goto LAB_0015249a;
          }
          if ((LVar3 == LYS_INPUT) || (LVar3 == LYS_OUTPUT)) {
            yang_tpdf_free(ctx,*(lys_tpdf **)node->hash,0,*(uint16_t *)(node->padding + 2));
            free(*(void **)node->hash);
            lVar7 = 0;
            for (uVar5 = 0; pcVar4 = node[1].name, uVar5 < node->padding[1]; uVar5 = uVar5 + 1) {
              lys_restr_free(ctx,(lys_restr *)(pcVar4 + lVar7),
                             (_func_void_lys_node_ptr_void_ptr *)0x0);
              lVar7 = lVar7 + 0x38;
            }
            goto LAB_0015249a;
          }
          if (LVar3 == LYS_GROUPING) goto LAB_00152091;
          if (LVar3 == LYS_USES) {
            for (uVar5 = 0; uVar5 < node->padding[2]; uVar5 = uVar5 + 1) {
              lVar7 = uVar5 * 0x50;
              lydict_remove(ctx,*(char **)(node[1].name + lVar7));
              lydict_remove(ctx,*(char **)(node[1].name + lVar7 + 8));
              lydict_remove(ctx,*(char **)(node[1].name + lVar7 + 0x10));
              lVar8 = 0;
              for (uVar6 = 0; pvVar2 = *(void **)(node[1].name + lVar7 + 0x38),
                  uVar6 < (byte)node[1].name[lVar7 + 0x1e]; uVar6 = uVar6 + 1) {
                lys_restr_free(ctx,(lys_restr *)((long)pvVar2 + lVar8),
                               (_func_void_lys_node_ptr_void_ptr *)0x0);
                lVar8 = lVar8 + 0x38;
              }
              free(pvVar2);
              for (uVar6 = 0; pvVar2 = *(void **)(node[1].name + lVar7 + 0x40),
                  uVar6 < (byte)node[1].name[lVar7 + 0x1f]; uVar6 = uVar6 + 1) {
                lydict_remove(ctx,*(char **)((long)pvVar2 + uVar6 * 8));
              }
              free(pvVar2);
              pcVar4 = node[1].name;
              if ((pcVar4[lVar7 + 0x1c] & 1U) != 0) {
                lydict_remove(ctx,*(char **)(pcVar4 + lVar7 + 0x48));
                pcVar4 = node[1].name;
              }
              lys_extension_instances_free
                        (ctx,*(lys_ext_instance ***)(pcVar4 + lVar7 + 0x20),
                         (uint)(byte)pcVar4[lVar7 + 0x1a],(_func_void_lys_node_ptr_void_ptr *)0x0);
            }
            free(node[1].name);
            lys_when_free(ctx,*(lys_when **)node->hash,(_func_void_lys_node_ptr_void_ptr *)0x0);
          }
          else {
            if (LVar3 == LYS_ANYDATA) goto LAB_00152112;
            if (LVar3 == LYS_ACTION) goto LAB_00152091;
          }
        }
        goto switchD_001520b5_caseD_3;
      }
      lys_when_free(ctx,w,(_func_void_lys_node_ptr_void_ptr *)0x0);
switchD_001520b5_caseD_3:
      lys_extension_instances_free
                (ctx,node->ext,(uint)node->ext_size,(_func_void_lys_node_ptr_void_ptr *)0x0);
      yang_free_nodes(ctx,node_00);
      free(node);
      node = plVar1;
    }
  }
  return;
}

Assistant:

static void
yang_free_nodes(struct ly_ctx *ctx, struct lys_node *node)
{
    struct lys_node *tmp, *child, *sibling;

    if (!node) {
        return;
    }
    tmp = node;

    while (tmp) {
        child = tmp->child;
        sibling = tmp->next;
        /* common part */
        lydict_remove(ctx, tmp->name);
        if (!(tmp->nodetype & (LYS_INPUT | LYS_OUTPUT))) {
            lys_iffeature_free(ctx, tmp->iffeature, tmp->iffeature_size, 0, NULL);
            lydict_remove(ctx, tmp->dsc);
            lydict_remove(ctx, tmp->ref);
        }

        switch (tmp->nodetype) {
        case LYS_GROUPING:
        case LYS_RPC:
        case LYS_ACTION:
            yang_free_grouping(ctx, (struct lys_node_grp *)tmp);
            break;
        case LYS_CONTAINER:
            yang_free_container(ctx, (struct lys_node_container *)tmp);
            break;
        case LYS_LEAF:
            yang_free_leaf(ctx, (struct lys_node_leaf *)tmp);
            break;
        case LYS_LEAFLIST:
            yang_free_leaflist(ctx, (struct lys_node_leaflist *)tmp);
            break;
        case LYS_LIST:
            yang_free_list(ctx, (struct lys_node_list *)tmp);
            break;
        case LYS_CHOICE:
            yang_free_choice(ctx, (struct lys_node_choice *)tmp);
            break;
        case LYS_CASE:
            lys_when_free(ctx, ((struct lys_node_case *)tmp)->when, NULL);
            break;
        case LYS_ANYXML:
        case LYS_ANYDATA:
            yang_free_anydata(ctx, (struct lys_node_anydata *)tmp);
            break;
        case LYS_INPUT:
        case LYS_OUTPUT:
            yang_free_inout(ctx, (struct lys_node_inout *)tmp);
            break;
        case LYS_NOTIF:
            yang_free_notif(ctx, (struct lys_node_notif *)tmp);
            break;
        case LYS_USES:
            yang_free_uses(ctx, (struct lys_node_uses *)tmp);
            break;
        default:
            break;
        }
        lys_extension_instances_free(ctx, tmp->ext, tmp->ext_size, NULL);
        yang_free_nodes(ctx, child);
        free(tmp);
        tmp = sibling;
    }
}